

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stats.h
# Opt level: O2

bool TestHighbitsCollisions<unsigned_long>
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *hashes)

{
  uint nbHBits;
  uint uVar1;
  uint uVar2;
  int b;
  int in_ESI;
  uint uVar3;
  bool bVar4;
  int nbHashes;
  double in_XMM0_Qa;
  double dVar5;
  uint local_44;
  double local_40;
  double local_38;
  
  nbHashes = (int)((ulong)((long)(hashes->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(hashes->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 3);
  nbHBits = FindMinBits_TargetCollisionShare(nbHashes,in_XMM0_Qa);
  uVar1 = FindMaxBits_TargetCollisionNb(nbHashes,in_ESI);
  bVar4 = true;
  if ((int)uVar1 < 0x40) {
    local_44 = 0;
    printf("Testing collisions (high %2i-%2i bits) - ",(ulong)nbHBits,(ulong)uVar1);
    uVar3 = 0;
    local_40 = 0.0;
    local_38 = 1.0;
    for (; (int)nbHBits <= (int)uVar1; nbHBits = nbHBits + 1) {
      uVar2 = CountNbCollisions<unsigned_long>(hashes,nbHBits);
      dVar5 = EstimateNbCollisions(nbHashes,nbHBits);
      if (local_40 < (double)(int)uVar2 / dVar5) {
        uVar3 = uVar2;
        local_44 = nbHBits;
        local_40 = (double)(int)uVar2 / dVar5;
        local_38 = dVar5;
      }
    }
    bVar4 = true;
    printf("Worst is %2i bits: %2i/%2i (%.2fx)",local_40,(ulong)local_44,(ulong)uVar3,(int)local_38)
    ;
    if (2.0 < local_40) {
      puts(" !!!!!");
      bVar4 = false;
    }
    else {
      putchar(10);
    }
  }
  return bVar4;
}

Assistant:

bool TestHighbitsCollisions ( std::vector<hashtype> & hashes)
{
  int origBits = sizeof(hashtype) * 8;

  size_t const nbH = hashes.size();
  int const minBits = FindMinBits_TargetCollisionShare(nbH, 0.01);
  int const maxBits = FindMaxBits_TargetCollisionNb(nbH, 20);
  if (maxBits >= origBits) return true;

  printf("Testing collisions (high %2i-%2i bits) - ", minBits, maxBits);
  double maxCollDev = 0.0;
  int maxCollDevBits = 0;
  int maxCollDevNb = 0;
  double maxCollDevExp = 1.0;

  for (int b = minBits; b <= maxBits; b++) {
      int    const nbColls = CountNbCollisions(hashes, b);
      double const expected = EstimateNbCollisions(nbH, b);
      assert(expected > 0.0);
      double const dev = (double)nbColls / expected;
      if (dev > maxCollDev) {
          maxCollDev = dev;
          maxCollDevBits = b;
          maxCollDevNb = nbColls;
          maxCollDevExp = expected;
      }
  }

  printf("Worst is %2i bits: %2i/%2i (%.2fx)",
        maxCollDevBits, maxCollDevNb, (int)maxCollDevExp, maxCollDev);

  if (maxCollDev > 2.0) {
    printf(" !!!!!\n");
    return false;
  }

  printf("\n");
  return true;
}